

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGenericPoolAllocator.cpp
# Opt level: O1

void * __thiscall cbtGenericMemoryPool::allocate(cbtGenericMemoryPool *this,size_t size_bytes)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  void *pvVar4;
  size_t num_elements;
  
  num_elements = (size_bytes / *(ulong *)(this + 0x28) + 1) -
                 (ulong)(size_bytes % *(ulong *)(this + 0x28) == 0);
  sVar2 = allocate_from_free_nodes(this,num_elements);
  if (sVar2 == 0xffffffff) {
    lVar1 = *(long *)(this + 0x18);
    lVar3 = 0xffffffff;
    if (lVar1 + num_elements <= *(ulong *)(this + 0x30)) {
      *(size_t *)(*(long *)(this + 0x10) + lVar1 * 8) = num_elements;
      *(size_t *)(this + 0x18) = *(long *)(this + 0x18) + num_elements;
      lVar3 = lVar1;
    }
    if (lVar3 == 0xffffffff) {
      pvVar4 = (void *)0x0;
    }
    else {
      pvVar4 = (void *)(lVar3 * *(long *)(this + 0x28) + *(long *)this);
    }
  }
  else {
    pvVar4 = (void *)(sVar2 * *(long *)(this + 0x28) + *(long *)this);
  }
  return pvVar4;
}

Assistant:

void *cbtGenericMemoryPool::allocate(size_t size_bytes)
{
	size_t module = size_bytes % m_element_size;
	size_t element_count = size_bytes / m_element_size;
	if (module > 0) element_count++;

	size_t alloc_pos = allocate_from_free_nodes(element_count);
	// a free node is found
	if (alloc_pos != BT_UINT_MAX)
	{
		return get_element_data(alloc_pos);
	}
	// allocate directly on pool
	alloc_pos = allocate_from_pool(element_count);

	if (alloc_pos == BT_UINT_MAX) return NULL;  // not space
	return get_element_data(alloc_pos);
}